

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FAudio.c
# Opt level: O1

uint32_t FAudioVoice_SetOutputFilterParameters
                   (FAudioVoice *voice,FAudioVoice *pDestinationVoice,
                   FAudioFilterParameters *pParameters,uint32_t OperationSet)

{
  uint uVar1;
  FAudioSendDescriptor *pFVar2;
  FAudioVoice *pFVar3;
  uint32_t uVar4;
  long lVar5;
  FAudioVoice **ppFVar6;
  bool bVar7;
  
  if ((OperationSet == 0) || (voice->audio->active == '\0')) {
    if (voice->type == FAUDIO_VOICE_MASTER) {
      return 0;
    }
    FAudio_PlatformLockMutex(voice->sendLock);
    if (pDestinationVoice == (FAudioVoice *)0x0) {
      if ((voice->sends).SendCount == 1) {
        pDestinationVoice = ((voice->sends).pSends)->pOutputVoice;
      }
      else {
        pDestinationVoice = (FAudioVoice *)0x0;
      }
    }
    uVar1 = (voice->sends).SendCount;
    bVar7 = uVar1 != 0;
    if (bVar7) {
      pFVar2 = (voice->sends).pSends;
      if (pDestinationVoice == pFVar2->pOutputVoice) {
        lVar5 = 0;
      }
      else {
        lVar5 = 0;
        ppFVar6 = &pFVar2[1].pOutputVoice;
        do {
          if (uVar1 - 1 == (int)lVar5) goto LAB_00115bf4;
          lVar5 = lVar5 + 1;
          pFVar3 = *ppFVar6;
          ppFVar6 = (FAudioVoice **)((long)ppFVar6 + 0xc);
        } while (pDestinationVoice != pFVar3);
        bVar7 = (uint)lVar5 < uVar1;
      }
      if (bVar7) {
        if (((voice->sends).pSends[lVar5].Flags & 0x80) != 0) {
          SDL_memcpy(voice->sendFilter + lVar5,pParameters,0xc);
        }
        FAudio_PlatformUnlockMutex(voice->sendLock);
        goto LAB_00115b49;
      }
    }
LAB_00115bf4:
    FAudio_PlatformUnlockMutex(voice->sendLock);
    uVar4 = 0x88960001;
  }
  else {
    FAudio_OPERATIONSET_QueueSetOutputFilterParameters
              (voice,pDestinationVoice,pParameters,OperationSet);
LAB_00115b49:
    uVar4 = 0;
  }
  return uVar4;
}

Assistant:

uint32_t FAudioVoice_SetOutputFilterParameters(
	FAudioVoice *voice,
	FAudioVoice *pDestinationVoice,
	const FAudioFilterParameters *pParameters,
	uint32_t OperationSet
) {
	uint32_t i;
	LOG_API_ENTER(voice->audio)

	if (OperationSet != FAUDIO_COMMIT_NOW && voice->audio->active)
	{
		FAudio_OPERATIONSET_QueueSetOutputFilterParameters(
			voice,
			pDestinationVoice,
			pParameters,
			OperationSet
		);
		LOG_API_EXIT(voice->audio)
		return 0;
	}

	/* MSDN: "This method is usable only on source and submix voices and
	 * has no effect on mastering voices."
	 */
	if (voice->type == FAUDIO_VOICE_MASTER)
	{
		LOG_API_EXIT(voice->audio)
		return 0;
	}

	FAudio_PlatformLockMutex(voice->sendLock);
	LOG_MUTEX_LOCK(voice->audio, voice->sendLock)

	/* Find the send index */
	if (pDestinationVoice == NULL && voice->sends.SendCount == 1)
	{
		pDestinationVoice = voice->sends.pSends[0].pOutputVoice;
	}
	for (i = 0; i < voice->sends.SendCount; i += 1)
	{
		if (pDestinationVoice == voice->sends.pSends[i].pOutputVoice)
		{
			break;
		}
	}
	if (i >= voice->sends.SendCount)
	{
		LOG_ERROR(
			voice->audio,
			"Destination not attached to source: %p %p",
			(void*) voice,
			(void*) pDestinationVoice
		)
		FAudio_PlatformUnlockMutex(voice->sendLock);
		LOG_MUTEX_UNLOCK(voice->audio, voice->sendLock)
		LOG_API_EXIT(voice->audio)
		return FAUDIO_E_INVALID_CALL;
	}

	if (!(voice->sends.pSends[i].Flags & FAUDIO_SEND_USEFILTER))
	{
		FAudio_PlatformUnlockMutex(voice->sendLock);
		LOG_MUTEX_UNLOCK(voice->audio, voice->sendLock)
		LOG_API_EXIT(voice->audio)
		return 0;
	}

	/* Set the filter parameters, finally. */
	FAudio_memcpy(
		&voice->sendFilter[i],
		pParameters,
		sizeof(FAudioFilterParameters)
	);

	FAudio_PlatformUnlockMutex(voice->sendLock);
	LOG_MUTEX_UNLOCK(voice->audio, voice->sendLock)
	LOG_API_EXIT(voice->audio)
	return 0;
}